

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringClass.cpp
# Opt level: O2

String * __thiscall StringList::join(String *__return_storage_ptr__,StringList *this,String *delim)

{
  string *psVar1;
  string *psVar2;
  string *psVar3;
  _Map_pointer local_80;
  string local_70 [32];
  string local_50 [32];
  
  (__return_storage_ptr__->_string)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->_string).field_2;
  (__return_storage_ptr__->_string)._M_string_length = 0;
  (__return_storage_ptr__->_string).field_2._M_local_buf[0] = '\0';
  psVar3 = (string *)
           (this->super_List<String>)._deque.super__Deque_base<String,_std::allocator<String>_>.
           _M_impl.super__Deque_impl_data._M_start._M_cur;
  psVar2 = (string *)
           (this->super_List<String>)._deque.super__Deque_base<String,_std::allocator<String>_>.
           _M_impl.super__Deque_impl_data._M_start._M_last;
  local_80 = (this->super_List<String>)._deque.super__Deque_base<String,_std::allocator<String>_>.
             _M_impl.super__Deque_impl_data._M_start._M_node;
  psVar1 = (string *)
           (this->super_List<String>)._deque.super__Deque_base<String,_std::allocator<String>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  while (psVar3 != psVar1) {
    if (*(__return_storage_ptr__->_string)._M_dataplus._M_p != '\0') {
      std::__cxx11::string::string(local_50,(string *)delim);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::~string(local_50);
    }
    std::__cxx11::string::string(local_70,psVar3);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::~string(local_70);
    psVar3 = psVar3 + 0x20;
    if (psVar3 == psVar2) {
      psVar3 = (string *)local_80[1];
      local_80 = local_80 + 1;
      psVar2 = psVar3 + 0x200;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String StringList::join (const String& delim)
{
	String result;

	for (const String& it : deque())
	{
		if (result.isEmpty() == false)
			result += delim;

		result += it;
	}

	return result;
}